

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O3

void __thiscall SpotLight_Power_Test::TestBody(SpotLight_Power_Test *this)

{
  double dVar1;
  float fVar2;
  undefined8 uVar3;
  int i;
  Allocator alloc;
  long lVar4;
  ulong uVar5;
  char *message;
  int i_1;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar12 [64];
  undefined1 auVar15 [16];
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  SampledSpectrum SVar16;
  Vector3f wl;
  AssertionResult gtest_ar;
  SampledWavelengths lambda;
  SpotLight light;
  Transform id;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  double local_208;
  AssertHelper local_200;
  double local_1f8;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  internal local_1e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  double local_1d0;
  undefined8 local_1c8;
  undefined1 local_1b8 [16];
  SampledWavelengths local_1a8;
  SpectrumHandle local_180;
  SpotLight local_178;
  Transform local_a8;
  
  local_1b8._8_8_ = local_1b8._0_8_;
  if (TestBody()::I == '\0') {
    TestBody();
  }
  pbrt::Transform::Transform(&local_a8);
  local_1a8.lambda.values[0] = 0.0;
  local_1a8.lambda.values[1] = 0.0;
  local_1a8.lambda.values[2] = 0.0;
  local_1a8.lambda.values[3] = 0.0;
  local_180.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0x1000002f2e750;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::SpotLight::SpotLight
            (&local_178,&local_a8,(MediumInterface *)&local_1a8,&local_180,1.0,60.0,40.0,alloc);
  lVar4 = 1;
  local_1a8.lambda.values[1] = 0.0;
  local_1a8.lambda.values[2] = 0.0;
  local_1a8.lambda.values[3] = 0.0;
  fVar8 = 595.0;
  local_1a8.lambda.values[0] = 595.0;
  do {
    fVar8 = fVar8 + 117.5;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar8),SUB6416(ZEXT464(0x444f8000),0),0xe);
    bVar7 = (bool)((byte)uVar3 & 1);
    fVar8 = (float)((uint)bVar7 * (int)(fVar8 + -830.0 + 360.0) + (uint)!bVar7 * (int)fVar8);
    local_1a8.lambda.values[lVar4] = fVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  uVar13 = 0x3b0b7034;
  uVar14 = 0x3b0b7034;
  local_1a8.pdf.values[0] = 0.0021276595;
  local_1a8.pdf.values[1] = 0.0021276595;
  local_1a8.pdf.values[2] = 0.0021276595;
  local_1a8.pdf.values[3] = 0.0021276595;
  SVar16 = pbrt::SpotLight::Phi(&local_178,&local_1a8);
  local_1c8 = SVar16.values.values._0_8_;
  local_1b8._4_4_ = uVar14;
  local_1b8._0_4_ = uVar13;
  uVar6 = 0;
  local_1e8 = 0.5;
  local_1ec = 0.33333334;
  auVar12 = ZEXT464(0) << 0x20;
  do {
    local_1d0 = auVar12._0_8_;
    auVar9 = ZEXT816(0) << 0x40;
    auVar10 = ZEXT816(0) << 0x40;
    auVar15 = SUB6416(ZEXT464(0x3f800000),0);
    if (uVar6 != 0) {
      auVar12 = ZEXT1664(auVar15);
      lVar4 = 0;
      uVar5 = uVar6;
      do {
        fVar8 = local_1e8 * auVar12._0_4_;
        auVar12 = ZEXT464((uint)fVar8);
        lVar4 = (lVar4 - uVar5 / 2) * 2 + uVar5;
        bVar7 = 1 < uVar5;
        uVar5 = uVar5 / 2;
      } while (bVar7);
      auVar9._4_4_ = in_XMM6_Db;
      auVar9._0_4_ = in_XMM6_Da;
      auVar9._8_8_ = in_XMM6_Qb;
      auVar9 = vcvtusi2ss_avx512f(auVar9,lVar4);
      lVar4 = 0;
      auVar12 = ZEXT1664(auVar15);
      uVar5 = uVar6;
      do {
        fVar2 = local_1ec * auVar12._0_4_;
        auVar12 = ZEXT464((uint)fVar2);
        lVar4 = (lVar4 - uVar5 / 3) * 3 + uVar5;
        bVar7 = 2 < uVar5;
        uVar5 = uVar5 / 3;
      } while (bVar7);
      auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar8 * auVar9._0_4_)));
      auVar10._4_4_ = in_XMM6_Db;
      auVar10._0_4_ = in_XMM6_Da;
      auVar10._8_8_ = in_XMM6_Qb;
      auVar10 = vcvtusi2ss_avx512f(auVar10,lVar4);
      auVar10 = ZEXT416((uint)(fVar2 * auVar10._0_4_));
    }
    auVar9 = vfmadd132ss_fma(auVar9,auVar15,ZEXT416(0xc0000000));
    auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar10);
    local_1f8 = (double)CONCAT44(local_1f8._4_4_,auVar9._0_4_);
    auVar9 = vfnmadd213ss_fma(auVar9,auVar9,auVar15);
    auVar9 = vmaxss_avx(auVar9,ZEXT416(0));
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    local_1e4 = auVar10._0_4_ * 6.2831855;
    local_208 = (double)CONCAT44(local_208._4_4_,auVar9._0_4_);
    fVar8 = cosf(local_1e4);
    local_1b8 = ZEXT416((uint)(fVar8 * local_208._0_4_));
    fVar8 = sinf(local_1e4);
    auVar9 = vinsertps_avx(local_1b8,ZEXT416((uint)(fVar8 * local_208._0_4_)),0x10);
    wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar9._0_8_;
    wl.super_Tuple3<pbrt::Vector3,_float>.z = local_1f8._0_4_;
    SVar16 = pbrt::SpotLight::I(&local_178,wl,&local_1a8);
    uVar6 = uVar6 + 1;
    dVar1 = local_1d0 + (double)SVar16.values.values[0];
    auVar12 = ZEXT864((ulong)dVar1);
  } while (uVar6 != 0x100000);
  local_208 = dVar1 / 83443.0234375;
  local_1f8 = (double)(float)local_1c8;
  local_200.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  auVar15._8_8_ = 0x7fffffffffffffff;
  auVar15._0_8_ = 0x7fffffffffffffff;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_208 - local_1f8;
  auVar9 = vandpd_avx512vl(auVar11,auVar15);
  local_210.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar9);
  testing::internal::CmpHelperLT<double,double>
            (local_1e0,"std::abs(phiSampled - phi[0])","1e-3",(double *)&local_210,
             (double *)&local_200);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_210.ptr_ + 0x10)," qmc: ",6);
    std::ostream::_M_insert<double>(local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_210.ptr_ + 0x10),", closed-form: ",0xf);
    std::ostream::_M_insert<double>(local_1f8);
    if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_1d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_210.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar7 = testing::internal::IsTrue(true);
      if ((bVar7) &&
         (local_210.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_210.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_178.Iemit.values);
  return;
}

Assistant:

TEST(SpotLight, Power) {
    static ConstantSpectrum I(10.);
    Transform id;
    SpotLight light(id, MediumInterface(), &I, 1.f /* scale */, 60 /* total width */,
                    40 /* falloff start */, Allocator());

    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    SampledSpectrum phi = light.Phi(lambda);

    int nSamples = 1024 * 1024;
    double phiSampled = 0;
    for (int i = 0; i < nSamples; ++i) {
        Vector3f w = SampleUniformSphere({RadicalInverse(0, i), RadicalInverse(1, i)});
        phiSampled += light.I(w, lambda)[0];
    }
    phiSampled /= (nSamples * UniformSpherePDF());

    EXPECT_LT(std::abs(phiSampled - phi[0]), 1e-3)
        << " qmc: " << phiSampled << ", closed-form: " << phi[0];
}